

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ambient_light.cpp
# Opt level: O1

Light_EvalRes * embree::AmbientLight_eval(Light *super,DifferentialGeometry *dg,Vec3fa *dir)

{
  undefined8 uVar1;
  Light_EvalRes *res;
  Light_EvalRes *in_RDI;
  float fVar2;
  float fVar3;
  
  uVar1 = *(undefined8 *)(super + 6);
  *(undefined8 *)&(in_RDI->value).field_0 = *(undefined8 *)(super + 4);
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = uVar1;
  in_RDI->dist = INFINITY;
  fVar2 = (dg->Ns).field_0.m128[2] * (dir->field_0).m128[2] +
          (dg->Ns).field_0.m128[1] * (dir->field_0).m128[1] +
          (dg->Ns).field_0.m128[0] * (dir->field_0).m128[0];
  fVar3 = 0.0;
  if (0.0 <= fVar2) {
    fVar3 = fVar2;
  }
  in_RDI->pdf = fVar3 / 3.1415927;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes AmbientLight_eval(const Light* super,
                                                             const DifferentialGeometry& dg,
                                                             const Vec3fa& dir)
{
  AmbientLight* self = (AmbientLight*)super;
  Light_EvalRes res;

  res.value = self->radiance;
  res.dist = inf;
  res.pdf = cosineSampleHemispherePDF(max(dot(dg.Ns, dir), 0.f));

  return res;
}